

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchAllExpr(BinaryReaderInterp *this)

{
  uint uVar1;
  pointer pHVar2;
  pointer pLVar3;
  pointer pLVar4;
  Result RVar5;
  Offset OVar6;
  Label *pLVar7;
  Enum EVar8;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  Var::Var(&local_78);
  EVar8 = Error;
  RVar5 = SharedValidator::OnCatch(&this->validator_,&loc,&local_78,true);
  Var::~Var(&local_78);
  if (RVar5.enum_ != Error) {
    pLVar7 = TopLabel(this);
    uVar1 = pLVar7->handler_desc_index;
    pHVar2 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar2[uVar1].kind = Catch;
    if (pLVar7->kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    OVar6 = pLVar7->offset;
    Istream::Emit(this->istream_,Br);
    if (OVar6 != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6a6,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchAllExpr()"
                   );
    }
    pLVar3 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar6 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar3 - (long)pLVar4) >> 4) - 1,OVar6
                    );
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar2[uVar1].try_end_offset == 0xffffffff) {
      OVar6 = Istream::end(this->istream_);
      pHVar2[uVar1].try_end_offset = OVar6;
    }
    pLVar7->kind = Block;
    OVar6 = Istream::end(this->istream_);
    pHVar2[uVar1].field_4.catch_all_offset = OVar6;
    EVar8 = Ok;
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnCatchAllExpr() {
  CHECK_RESULT(validator_.OnCatch(GetLocation(), Var(), true));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  label->kind = LabelKind::Block;
  desc.catch_all_offset = istream_.end();
  return Result::Ok;
}